

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.hpp
# Opt level: O3

clause_size_t bal::Cnf::normalize_clause(uint32_t *literals,clause_size_t literals_size)

{
  uint uVar1;
  long lVar2;
  ushort uVar3;
  ulong uVar4;
  undefined6 in_register_00000032;
  ulong uVar5;
  
  if ((int)CONCAT62(in_register_00000032,literals_size) == 0) {
    __assert_fail("literals_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.hpp"
                  ,0xf3,
                  "static clause_size_t bal::Cnf::normalize_clause(uint32_t *const, const clause_size_t)"
                 );
  }
  lVar2 = 0x3f;
  if (literals_size != 0) {
    for (; literals_size >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
            (literals,literals + literals_size,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
  std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
            (literals,literals + literals_size);
  if (2 < *literals + 1) {
    uVar3 = 1;
    if (literals_size != 1) {
      uVar3 = 1;
      uVar4 = 1;
      do {
        uVar1 = literals[uVar4];
        if (uVar1 + 1 < 3) {
          __assert_fail("literal_t__is_variable(literals[i])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.hpp"
                        ,0xfa,
                        "static clause_size_t bal::Cnf::normalize_clause(uint32_t *const, const clause_size_t)"
                       );
        }
        uVar5 = (ulong)uVar3;
        if (uVar1 != literals[uVar5 - 1]) {
          if ((literals[uVar5 - 1] ^ uVar1) == 1) {
            return 0;
          }
          if (uVar5 < uVar4) {
            literals[uVar5] = uVar1;
          }
          uVar3 = uVar3 + 1;
        }
        uVar4 = uVar4 + 1;
      } while (literals_size != uVar4);
    }
    return uVar3;
  }
  __assert_fail("literal_t__is_variable(literals[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.hpp"
                ,0xf7,
                "static clause_size_t bal::Cnf::normalize_clause(uint32_t *const, const clause_size_t)"
               );
}

Assistant:

inline static clause_size_t normalize_clause(uint32_t* const literals, const clause_size_t literals_size) {
            assert(literals_size > 0);
            
            std::sort(literals, literals + literals_size);
            
            assert(literal_t__is_variable(literals[0]));
            clause_size_t validated_size = 1;
            for (auto i = 1; i < literals_size; i++) {
                assert(literal_t__is_variable(literals[i]));
                if (literals[i] == literals[validated_size - 1]) {
                    //warning(literals_size, literals, "ignoring duplicate literal");
                    continue;
                } else if ((literals[i] ^ 0x1) == literals[validated_size - 1]) {
                    //warning(literals_size, literals, "ignoring the clause, always satisfied");
                    return 0;
                } else {
                    if (validated_size < i) {
                        literals[validated_size] = literals[i];
                    };
                    validated_size++;
                };
            };
            
            return validated_size;
        }